

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeCurve::Create(ON_PolyEdgeCurve *this,ON_BrepTrim *trim,ON_UUID *object_id)

{
  ON_PolyEdgeSegment *this_00;
  ON_PolyEdgeSegment *segment;
  bool rc;
  ON_UUID *object_id_local;
  ON_BrepTrim *trim_local;
  ON_PolyEdgeCurve *this_local;
  
  segment._7_1_ = false;
  ON_PolyCurve::Destroy(&this->super_ON_PolyCurve);
  if (trim != (ON_BrepTrim *)0x0) {
    this_00 = (ON_PolyEdgeSegment *)operator_new(0x198);
    ON_PolyEdgeSegment::ON_PolyEdgeSegment(this_00);
    segment._7_1_ = ON_PolyEdgeSegment::Create(this_00,trim,object_id);
    if (segment._7_1_) {
      Append(this,this_00);
    }
    else if (this_00 != (ON_PolyEdgeSegment *)0x0) {
      (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[4])();
    }
  }
  return segment._7_1_;
}

Assistant:

bool ON_PolyEdgeCurve::Create( const ON_BrepTrim* trim, const ON_UUID& object_id )
{
  bool rc = false;
  Destroy();
  //m_is_closed_helper = 0;
  if ( trim )
  {
    ON_PolyEdgeSegment* segment = new ON_PolyEdgeSegment();
    rc = segment->Create(trim,object_id);
    if (rc )
      Append(segment);
    else
      delete segment;
  }
  return rc;
}